

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::CustomExternalWrapperObject::HasPropertyQuery
          (CustomExternalWrapperObject *this,PropertyId propertyId,PropertyValueInfo *info)

{
  anon_class_24_3_0208e3e3 fn_00;
  anon_class_16_2_4c80b24b getPropertyName_00;
  BOOL val;
  PropertyQueryFlags PVar1;
  anon_class_16_2_4c80b24b getPropertyName;
  anon_class_24_3_0208e3e3 fn;
  PropertyValueInfo *info_local;
  CustomExternalWrapperObject *pCStack_10;
  PropertyId propertyId_local;
  CustomExternalWrapperObject *this_local;
  
  fn.this = (CustomExternalWrapperObject *)((long)&info_local + 4);
  fn.propertyId = (PropertyId *)&fn.info;
  getPropertyName_00.propertyId = (PropertyId *)((long)&info_local + 4);
  getPropertyName_00.this = this;
  fn_00.propertyId = (PropertyId *)fn.this;
  fn_00.this = this;
  fn_00.info = (PropertyValueInfo **)fn.propertyId;
  fn.info = (PropertyValueInfo **)info;
  info_local._4_4_ = propertyId;
  pCStack_10 = this;
  val = HasPropertyTrap<Js::CustomExternalWrapperObject::HasPropertyQuery(int,Js::PropertyValueInfo*)::__0,Js::CustomExternalWrapperObject::HasPropertyQuery(int,Js::PropertyValueInfo*)::__1>
                  (this,fn_00,getPropertyName_00,info);
  PVar1 = JavascriptConversion::BooleanToPropertyQueryFlags(val);
  return PVar1;
}

Assistant:

Js::PropertyQueryFlags CustomExternalWrapperObject::HasPropertyQuery(Js::PropertyId propertyId, _Inout_opt_ Js::PropertyValueInfo* info)
{
    auto fn = [&](RecyclableObject* object)->BOOL {
        return JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::HasPropertyQuery(propertyId, info));
    };
    auto getPropertyName = [&](Js::ScriptContext * requestContext, Js::Var * isPropertyNameNumeric, Js::Var * propertyNameNumericValue)->Js::Var
    {
        return GetName(requestContext, propertyId, isPropertyNameNumeric, propertyNameNumericValue);
    };
    return Js::JavascriptConversion::BooleanToPropertyQueryFlags(HasPropertyTrap(fn, getPropertyName, info));
}